

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_open(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  char *__file;
  JSValueUnion JVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValue JVar5;
  JSValue val;
  int mode;
  int flags;
  
  __file = JS_ToCString(ctx,*argv);
  iVar4 = 6;
  if (__file != (char *)0x0) {
    iVar1 = JS_ToInt32(ctx,&flags,argv[1]);
    if (iVar1 == 0) {
      if ((argc < 3) || ((int)argv[2].tag == 3)) {
        mode = 0x1b6;
        uVar3 = 0x1b6;
      }
      else {
        val.tag = argv[2].tag;
        val.u.ptr = argv[2].u.ptr;
        iVar1 = JS_ToInt32(ctx,&mode,val);
        if (iVar1 != 0) goto LAB_001103a6;
        uVar3 = (ulong)(uint)mode;
      }
      iVar4 = 0;
      iVar1 = open(__file,flags,uVar3);
      uVar3 = js_get_errno((long)iVar1);
      JS_FreeCString(ctx,__file);
      JVar2.ptr = (void *)(uVar3 & 0xffffffff);
      goto LAB_001103b3;
    }
LAB_001103a6:
    JS_FreeCString(ctx,__file);
  }
  JVar2.float64 = 0.0;
LAB_001103b3:
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_open(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    const char *filename;
    int flags, mode, ret;

    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &flags, argv[1]))
        goto fail;
    if (argc >= 3 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32(ctx, &mode, argv[2])) {
        fail:
            JS_FreeCString(ctx, filename);
            return JS_EXCEPTION;
        }
    } else {
        mode = 0666;
    }
#if defined(_WIN32)
    /* force binary mode by default */
    if (!(flags & O_TEXT))
        flags |= O_BINARY;
#endif
    ret = js_get_errno(open(filename, flags, mode));
    JS_FreeCString(ctx, filename);
    return JS_NewInt32(ctx, ret);
}